

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

string * __thiscall
google::protobuf::gtest_ArenaStringSingleArena_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,TestParamInfo<bool> *info)

{
  bool bVar1;
  ParamGenerator<bool> local_38;
  undefined1 local_28 [8];
  tuple<testing::internal::ParamGenerator<bool>_> t;
  TestParamInfo<bool> *info_local;
  
  t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<bool>_>.
  super__Head_base<0UL,_testing::internal::ParamGenerator<bool>,_false>._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  bVar1 = testing::internal::AlwaysFalse();
  if (bVar1) {
    testing::internal::TestNotEmpty<std::__cxx11::string(testing::TestParamInfo<bool>const&)>
              (testing::internal::DefaultParamName<bool>);
    testing::Bool();
    std::make_tuple<testing::internal::ParamGenerator<bool>>((ParamGenerator<bool> *)local_28);
    testing::internal::ParamGenerator<bool>::~ParamGenerator(&local_38);
    std::tuple<testing::internal::ParamGenerator<bool>_>::~tuple
              ((tuple<testing::internal::ParamGenerator<bool>_> *)local_28);
  }
  testing::internal::DefaultParamName<bool>
            (__return_storage_ptr__,
             (TestParamInfo<bool> *)
             t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<bool>_>.
             super__Head_base<0UL,_testing::internal::ParamGenerator<bool>,_false>._M_head_impl.
             impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}